

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O0

void drawRectangle<((anonymous_namespace)::FillClip)1>
               (qint32 *bits,int width,int height,QPoint *int1,QPoint *center1,QPoint *ext1,
               QPoint *int2,QPoint *center2,QPoint *ext2,qint32 extValue)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  long in_FS_OFFSET;
  int in_stack_00000020;
  qint32 dd;
  qint32 div;
  qint32 ddC;
  int dxE;
  int dxC;
  int ext1Frac;
  int int1Frac;
  int center2Frac;
  int center1Frac;
  int ye2;
  int ye1;
  int yi2;
  int yi1;
  int yc2;
  int yc1;
  qint32 intValue;
  qint32 d;
  int xc2;
  int xc1;
  int xe2;
  int xe1;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  QPoint **in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  int *in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd64;
  int in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  int in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd98;
  undefined4 local_12c;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  undefined4 local_6c;
  int local_68;
  undefined4 local_64;
  int local_60;
  undefined4 local_5c;
  int local_58;
  undefined4 local_54;
  int local_50;
  undefined4 local_4c;
  int local_48;
  undefined4 local_44;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QPoint::y((QPoint *)0x7074c6);
  iVar2 = QPoint::y((QPoint *)0x7074da);
  if (iVar2 < iVar1) {
    qSwap<QPoint_const*>
              (in_stack_fffffffffffffd40,
               (QPoint **)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    qSwap<QPoint_const*>
              (in_stack_fffffffffffffd40,
               (QPoint **)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    qSwap<QPoint_const*>
              (in_stack_fffffffffffffd40,
               (QPoint **)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    in_stack_00000020 = -in_stack_00000020;
  }
  local_44 = 0;
  local_48 = QPoint::y((QPoint *)0x70754e);
  local_48 = local_48 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar1 = *piVar20;
  local_4c = 0;
  local_50 = QPoint::y((QPoint *)0x707596);
  local_50 = local_50 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar2 = *piVar20;
  local_54 = 0;
  local_58 = QPoint::y((QPoint *)0x7075de);
  local_58 = local_58 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar16 = *piVar20;
  local_5c = 0;
  local_60 = QPoint::y((QPoint *)0x707626);
  local_60 = local_60 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar17 = *piVar20;
  local_64 = 0;
  local_68 = QPoint::y((QPoint *)0x70766e);
  local_68 = local_68 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar18 = *piVar20;
  local_6c = 0;
  local_70 = QPoint::y((QPoint *)0x7076b6);
  local_70 = local_70 >> 8;
  piVar20 = qBound<int>(in_stack_fffffffffffffd50,
                        (int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                        (int *)in_stack_fffffffffffffd40);
  iVar19 = *piVar20;
  iVar3 = QPoint::y((QPoint *)0x707709);
  iVar3 = (iVar1 * 0x100 + 0xff) - iVar3;
  iVar4 = QPoint::y((QPoint *)0x70773e);
  iVar4 = (iVar2 * 0x100 + 0xff) - iVar4;
  iVar5 = QPoint::y((QPoint *)0x707773);
  iVar5 = (iVar16 * 0x100 + 0xff) - iVar5;
  iVar6 = QPoint::y((QPoint *)0x7077a8);
  iVar6 = (iVar18 * 0x100 + 0xff) - iVar6;
  local_c0 = 0;
  local_c4 = 0;
  local_c8 = 0;
  iVar7 = QPoint::y((QPoint *)0x7077e8);
  iVar8 = QPoint::y((QPoint *)0x7077fc);
  if (iVar7 != iVar8) {
    iVar7 = QPoint::x((QPoint *)0x70781a);
    iVar8 = QPoint::x((QPoint *)0x70782e);
    iVar9 = QPoint::y((QPoint *)0x707850);
    iVar10 = QPoint::y((QPoint *)0x707864);
    local_c0 = ((iVar7 - iVar8) * 0x100) / (iVar9 - iVar10);
    local_c8 = in_stack_00000020 << 9;
    iVar7 = QPoint::y((QPoint *)0x70789e);
    iVar8 = QPoint::y((QPoint *)0x7078b2);
    local_c8 = local_c8 / (iVar7 - iVar8);
  }
  iVar7 = QPoint::y((QPoint *)0x7078db);
  iVar8 = QPoint::y((QPoint *)0x7078ef);
  if (iVar7 != iVar8) {
    iVar7 = QPoint::x((QPoint *)0x707909);
    iVar8 = QPoint::x((QPoint *)0x70791d);
    iVar9 = QPoint::y((QPoint *)0x70793f);
    iVar10 = QPoint::y((QPoint *)0x707953);
    local_c4 = ((iVar7 - iVar8) * 0x100) / (iVar9 - iVar10);
  }
  iVar8 = QPoint::x((QPoint *)0x70797c);
  iVar9 = QPoint::x((QPoint *)0x707990);
  iVar10 = QPoint::y((QPoint *)0x7079af);
  iVar11 = QPoint::y((QPoint *)0x7079c3);
  iVar12 = QPoint::y((QPoint *)0x7079ec);
  iVar13 = QPoint::y((QPoint *)0x707a00);
  iVar14 = QPoint::x((QPoint *)0x707a1f);
  iVar15 = QPoint::x((QPoint *)0x707a33);
  iVar7 = in_stack_00000020;
  iVar8 = (iVar8 - iVar9) * (iVar10 - iVar11) - (iVar12 - iVar13) * (iVar14 - iVar15);
  if (iVar8 == 0) {
    local_12c = 0;
  }
  else {
    iVar9 = QPoint::y((QPoint *)0x707a7d);
    iVar10 = QPoint::y((QPoint *)0x707a91);
    local_12c = (undefined4)(((long)(iVar7 * (iVar9 - iVar10)) << 9) / (long)iVar8);
  }
  local_74 = -0x55555556;
  local_78 = -0x55555556;
  local_7c = -0x55555556;
  local_80 = -0x55555556;
  local_84 = -0x55555556;
  local_88 = -in_stack_00000020;
  iVar7 = QPoint::x((QPoint *)0x707b2f);
  iVar8 = QPoint::x((QPoint *)0x707b43);
  if (iVar7 < iVar8) {
    iVar7 = QPoint::y((QPoint *)0x707b61);
    iVar8 = QPoint::y((QPoint *)0x707b75);
    if (iVar7 < iVar8) {
      iVar7 = QPoint::x((QPoint *)0x707b93);
      iVar8 = QPoint::x((QPoint *)0x707bb5);
      iVar9 = QPoint::x((QPoint *)0x707bc9);
      iVar10 = QPoint::y((QPoint *)0x707bf2);
      iVar11 = QPoint::y((QPoint *)0x707c06);
      local_74 = iVar7 + (iVar6 * (iVar8 - iVar9)) / (iVar10 - iVar11);
      iVar6 = QPoint::x((QPoint *)0x707c3a);
      iVar7 = QPoint::x((QPoint *)0x707c5c);
      iVar8 = QPoint::x((QPoint *)0x707c70);
      iVar9 = QPoint::y((QPoint *)0x707c99);
      iVar10 = QPoint::y((QPoint *)0x707cad);
      local_78 = iVar6 + (iVar5 * (iVar7 - iVar8)) / (iVar9 - iVar10);
      if (iVar18 != iVar16) {
        iVar5 = QPoint::x((QPoint *)0x707cf5);
        iVar6 = QPoint::x((QPoint *)0x707d17);
        iVar7 = QPoint::x((QPoint *)0x707d2b);
        iVar8 = QPoint::y((QPoint *)0x707d54);
        iVar9 = QPoint::y((QPoint *)0x707d68);
        local_80 = (iVar18 - iVar1) * local_c0 + iVar5 + (iVar3 * (iVar6 - iVar7)) / (iVar8 - iVar9)
        ;
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&stack0x00000020 >> 0x20),(int)&stack0x00000020,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar16 != iVar19) {
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&stack0x00000020 >> 0x20),(int)&stack0x00000020,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar19 != iVar17) {
        iVar1 = QPoint::x((QPoint *)0x707ed6);
        iVar16 = QPoint::x((QPoint *)0x707ef8);
        iVar17 = QPoint::x((QPoint *)0x707f0c);
        iVar18 = QPoint::y((QPoint *)0x707f35);
        iVar3 = QPoint::y((QPoint *)0x707f49);
        local_7c = (iVar19 - iVar2) * local_c0 +
                   iVar1 + (iVar4 * (iVar16 - iVar17)) / (iVar18 - iVar3);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&local_88 >> 0x20),(int)&local_88,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
    }
    else {
      iVar7 = QPoint::x((QPoint *)0x70801f);
      iVar8 = QPoint::x((QPoint *)0x708041);
      iVar9 = QPoint::x((QPoint *)0x708055);
      iVar10 = QPoint::y((QPoint *)0x70807e);
      iVar11 = QPoint::y((QPoint *)0x708092);
      local_7c = iVar7 + (iVar4 * (iVar8 - iVar9)) / (iVar10 - iVar11);
      iVar4 = QPoint::x((QPoint *)0x7080c6);
      iVar7 = QPoint::x((QPoint *)0x7080e8);
      iVar8 = QPoint::x((QPoint *)0x7080fc);
      iVar9 = QPoint::y((QPoint *)0x708125);
      iVar10 = QPoint::y((QPoint *)0x708139);
      local_7c = (iVar19 - iVar2) * local_c0 + local_7c;
      local_80 = (iVar18 - iVar1) * local_c0 + iVar4 + (iVar3 * (iVar7 - iVar8)) / (iVar9 - iVar10);
      if (iVar18 != iVar19) {
        iVar1 = QPoint::x((QPoint *)0x7081c9);
        iVar2 = QPoint::x((QPoint *)0x7081eb);
        iVar18 = QPoint::x((QPoint *)0x7081ff);
        iVar3 = QPoint::y((QPoint *)0x708228);
        iVar4 = QPoint::y((QPoint *)0x70823c);
        local_74 = iVar1 + (iVar6 * (iVar2 - iVar18)) / (iVar3 - iVar4);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&stack0x00000020 >> 0x20),(int)&stack0x00000020,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar19 != iVar16) {
        iVar1 = QPoint::y((QPoint *)0x708313);
        iVar1 = ((iVar19 * 0x100 + 0xff) - iVar1) * 2 * in_stack_00000020;
        iVar2 = QPoint::y((QPoint *)0x70833c);
        iVar18 = QPoint::y((QPoint *)0x708350);
        local_84 = iVar1 / (iVar2 - iVar18);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,local_c8,(int)((ulong)&local_84 >> 0x20),(int)&local_84,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar16 != iVar17) {
        iVar1 = QPoint::x((QPoint *)0x708406);
        iVar2 = QPoint::x((QPoint *)0x708428);
        iVar16 = QPoint::x((QPoint *)0x70843c);
        iVar17 = QPoint::y((QPoint *)0x708465);
        iVar18 = QPoint::y((QPoint *)0x708479);
        local_78 = iVar1 + (iVar5 * (iVar2 - iVar16)) / (iVar17 - iVar18);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&local_88 >> 0x20),(int)&local_88,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
    }
  }
  else {
    iVar7 = QPoint::y((QPoint *)0x70852d);
    iVar8 = QPoint::y((QPoint *)0x708541);
    if (iVar7 < iVar8) {
      iVar7 = QPoint::x((QPoint *)0x70855f);
      iVar8 = QPoint::x((QPoint *)0x708581);
      iVar9 = QPoint::x((QPoint *)0x708595);
      iVar10 = QPoint::y((QPoint *)0x7085be);
      iVar11 = QPoint::y((QPoint *)0x7085d2);
      local_74 = iVar7 + (iVar6 * (iVar8 - iVar9)) / (iVar10 - iVar11);
      iVar6 = QPoint::x((QPoint *)0x708606);
      iVar7 = QPoint::x((QPoint *)0x708628);
      iVar8 = QPoint::x((QPoint *)0x70863c);
      iVar9 = QPoint::y((QPoint *)0x708665);
      iVar10 = QPoint::y((QPoint *)0x708679);
      local_78 = iVar6 + (iVar5 * (iVar7 - iVar8)) / (iVar9 - iVar10);
      if (iVar16 != iVar18) {
        iVar5 = QPoint::x((QPoint *)0x7086c1);
        iVar6 = QPoint::x((QPoint *)0x7086e3);
        iVar7 = QPoint::x((QPoint *)0x7086f7);
        iVar8 = QPoint::y((QPoint *)0x708720);
        iVar9 = QPoint::y((QPoint *)0x708734);
        local_7c = (iVar16 - iVar1) * local_c0 + iVar5 + (iVar3 * (iVar6 - iVar7)) / (iVar8 - iVar9)
        ;
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&local_88 >> 0x20),(int)&local_88,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar18 != iVar17) {
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&local_88 >> 0x20),(int)&local_88,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar17 != iVar19) {
        iVar1 = QPoint::x((QPoint *)0x7088a2);
        iVar16 = QPoint::x((QPoint *)0x7088c4);
        iVar18 = QPoint::x((QPoint *)0x7088d8);
        iVar19 = QPoint::y((QPoint *)0x708901);
        iVar3 = QPoint::y((QPoint *)0x708915);
        local_80 = (iVar17 - iVar2) * local_c0 +
                   iVar1 + (iVar4 * (iVar16 - iVar18)) / (iVar19 - iVar3);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&stack0x00000020 >> 0x20),(int)&stack0x00000020,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
    }
    else {
      iVar7 = QPoint::x((QPoint *)0x7089eb);
      iVar8 = QPoint::x((QPoint *)0x708a07);
      iVar9 = QPoint::x((QPoint *)0x708a18);
      iVar10 = QPoint::y((QPoint *)0x708a38);
      iVar11 = QPoint::y((QPoint *)0x708a49);
      local_7c = iVar7 + (iVar3 * (iVar8 - iVar9)) / (iVar10 - iVar11);
      iVar3 = QPoint::x((QPoint *)0x708a74);
      iVar7 = QPoint::x((QPoint *)0x708a93);
      iVar8 = QPoint::x((QPoint *)0x708aa4);
      iVar9 = QPoint::y((QPoint *)0x708ac7);
      iVar10 = QPoint::y((QPoint *)0x708adb);
      local_7c = (iVar16 - iVar1) * local_c0 + local_7c;
      local_80 = (iVar17 - iVar2) * local_c0 + iVar3 + (iVar4 * (iVar7 - iVar8)) / (iVar9 - iVar10);
      if (iVar16 != iVar17) {
        in_stack_fffffffffffffd98 = QPoint::x((QPoint *)0x708b6b);
        in_stack_fffffffffffffd88 = QPoint::x((QPoint *)0x708b87);
        iVar1 = QPoint::x((QPoint *)0x708b98);
        iVar1 = iVar5 * (in_stack_fffffffffffffd88 - iVar1);
        in_stack_fffffffffffffd90 = QPoint::y((QPoint *)0x708bb8);
        iVar2 = QPoint::y((QPoint *)0x708bc9);
        local_78 = in_stack_fffffffffffffd98 + iVar1 / (in_stack_fffffffffffffd90 - iVar2);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&local_88 >> 0x20),(int)&local_88,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c4),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,(qint32 *)CONCAT44(iVar5,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
        in_stack_fffffffffffffd8c = iVar5;
      }
      if (iVar17 != iVar18) {
        in_stack_fffffffffffffd7c = iVar17 * 0x100 + 0xff;
        iVar1 = QPoint::y((QPoint *)0x708c94);
        iVar1 = (in_stack_fffffffffffffd7c - iVar1) * 2 * in_stack_00000020;
        in_stack_fffffffffffffd80 = QPoint::y((QPoint *)0x708cb7);
        iVar2 = QPoint::y((QPoint *)0x708cc8);
        local_84 = iVar1 / (in_stack_fffffffffffffd80 - iVar2);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)1>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,local_c8,(int)((ulong)&local_84 >> 0x20),(int)&local_84,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),in_stack_fffffffffffffd70,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
      if (iVar18 != iVar19) {
        iVar1 = QPoint::x((QPoint *)0x708d78);
        iVar2 = QPoint::x((QPoint *)0x708d94);
        iVar16 = QPoint::x((QPoint *)0x708da5);
        iVar17 = QPoint::y((QPoint *)0x708dc5);
        iVar18 = QPoint::y((QPoint *)0x708dd6);
        local_74 = iVar1 + (iVar6 * (iVar2 - iVar16)) / (iVar17 - iVar18);
        fillLines<((anonymous_namespace)::FillClip)1,((anonymous_namespace)::FillVDir)0,((anonymous_namespace)::FillHDir)0>
                  ((qint32 *)CONCAT44(in_stack_fffffffffffffd64,local_12c),in_stack_fffffffffffffd5c
                   ,0,(int)((ulong)&stack0x00000020 >> 0x20),(int)&stack0x00000020,
                   (int *)CONCAT44(in_stack_fffffffffffffd4c,local_c0),iVar17,
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,iVar1),in_stack_fffffffffffffd80,
                   (qint32 *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                   in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void drawRectangle(qint32 *bits, int width, int height,
                   const QPoint *int1, const QPoint *center1, const QPoint *ext1,
                   const QPoint *int2, const QPoint *center2, const QPoint *ext2,
                   qint32 extValue)
{
    if (center1->y() > center2->y()) {
        qSwap(center1, center2);
        qSwap(int1, ext2);
        qSwap(ext1, int2);
        extValue = -extValue;
    }

    Q_ASSERT(ext1->x() - center1->x() == center1->x() - int1->x());
    Q_ASSERT(ext1->y() - center1->y() == center1->y() - int1->y());
    Q_ASSERT(ext2->x() - center2->x() == center2->x() - int2->x());
    Q_ASSERT(ext2->y() - center2->y() == center2->y() - int2->y());

    const int yc1 = clip == Clip ? qBound(0, center1->y() >> 8, height) : center1->y() >> 8;
    const int yc2 = clip == Clip ? qBound(0, center2->y() >> 8, height) : center2->y() >> 8;
    const int yi1 = clip == Clip ? qBound(0, int1->y() >> 8, height) : int1->y() >> 8;
    const int yi2 = clip == Clip ? qBound(0, int2->y() >> 8, height) : int2->y() >> 8;
    const int ye1 = clip == Clip ? qBound(0, ext1->y() >> 8, height) : ext1->y() >> 8;
    const int ye2 = clip == Clip ? qBound(0, ext2->y() >> 8, height) : ext2->y() >> 8;

    const int center1Frac = clip == Clip ? (yc1 << 8) + 0xff - center1->y() : ~center1->y() & 0xff;
    const int center2Frac = clip == Clip ? (yc2 << 8) + 0xff - center2->y() : ~center2->y() & 0xff;
    const int int1Frac = clip == Clip ? (yi1 << 8) + 0xff - int1->y() : ~int1->y() & 0xff;
    const int ext1Frac = clip == Clip ? (ye1 << 8) + 0xff - ext1->y() : ~ext1->y() & 0xff;

    int dxC = 0, dxE = 0; // cap slope, edge slope
    qint32 ddC = 0;
    if (ext1->y() != int1->y()) {
        dxC = ((ext1->x() - int1->x()) << 8) / (ext1->y() - int1->y());
        ddC = (extValue << 9) / (ext1->y() - int1->y());
    }
    if (ext1->y() != ext2->y())
        dxE = ((ext1->x() - ext2->x()) << 8) / (ext1->y() - ext2->y());

    const qint32 div = (ext1->x() - int1->x()) * (ext2->y() - int1->y())
                     - (ext1->y() - int1->y()) * (ext2->x() - int1->x());
    const qint32 dd = div ? qint32((qint64(extValue * (ext2->y() - ext1->y())) << 9) / div) : 0;

    int xe1, xe2, xc1, xc2;
    qint32 d;

    qint32 intValue = -extValue;

    if (center2->x() < center1->x()) {
        // Leaning to the right. '/'
        if (int1->y() < ext2->y()) {
            // Mostly vertical.
            Q_ASSERT(ext1->y() != ext2->y());
            xe1 = ext1->x() + ext1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
            xe2 = int1->x() + int1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
            if (ye1 != yi1) {
                xc2 = center1->x() + center1Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
                xc2 += (ye1 - yc1) * dxC;
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, ye1, yi1, xe1, dxE,
                                                      xc2, dxC, extValue, 0, dd);
            }
            if (yi1 != ye2)
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, yi1, ye2, xe1, dxE,
                                                      xe2, dxE, extValue, 0, dd);
            if (ye2 != yi2) {
                xc1 = center2->x() + center2Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
                xc1 += (ye2 - yc2) * dxC;
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, ye2, yi2, xc1, dxC,
                                                      xe2, dxE, intValue, 0, dd);
            }
        } else {
            // Mostly horizontal.
            Q_ASSERT(ext1->y() != int1->y());
            xc1 = center2->x() + center2Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
            xc2 = center1->x() + center1Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
            xc1 += (ye2 - yc2) * dxC;
            xc2 += (ye1 - yc1) * dxC;
            if (ye1 != ye2) {
                xe1 = ext1->x() + ext1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, ye1, ye2, xe1, dxE,
                                                      xc2, dxC, extValue, 0, dd);
            }
            if (ye2 != yi1) {
                d = (clip == Clip ? (ye2 << 8) + 0xff - center2->y()
                                  : (ext2->y() | 0xff) - center2->y())
                    * 2 * extValue / (ext1->y() - int1->y());
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, ye2, yi1, xc1, dxC,
                                                      xc2, dxC, d, ddC, dd);
            }
            if (yi1 != yi2) {
                xe2 = int1->x() + int1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, yi1, yi2, xc1, dxC,
                                                      xe2, dxE, intValue, 0, dd);
            }
        }
    } else {
        // Leaning to the left. '\'
        if (ext1->y() < int2->y()) {
            // Mostly vertical.
            Q_ASSERT(ext1->y() != ext2->y());
            xe1 = ext1->x() + ext1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
            xe2 = int1->x() + int1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
            if (yi1 != ye1) {
                xc1 = center1->x() + center1Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
                xc1 += (yi1 - yc1) * dxC;
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, yi1, ye1, xc1, dxC,
                                                      xe2, dxE, intValue, 0, dd);
            }
            if (ye1 != yi2)
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, ye1, yi2, xe1, dxE,
                                                      xe2, dxE, intValue, 0, dd);
            if (yi2 != ye2) {
                xc2 = center2->x() + center2Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
                xc2 += (yi2 - yc2) * dxC;
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, yi2, ye2, xe1, dxE,
                                                      xc2, dxC, extValue, 0, dd);
            }
        } else {
            // Mostly horizontal.
            Q_ASSERT(ext1->y() != int1->y());
            xc1 = center1->x() + center1Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
            xc2 = center2->x() + center2Frac * (ext1->x() - int1->x()) / (ext1->y() - int1->y());
            xc1 += (yi1 - yc1) * dxC;
            xc2 += (yi2 - yc2) * dxC;
            if (yi1 != yi2) {
                xe2 = int1->x() + int1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, yi1, yi2, xc1, dxC,
                                                      xe2, dxE, intValue, 0, dd);
            }
            if (yi2 != ye1) {
                d = (clip == Clip ? (yi2 << 8) + 0xff - center2->y()
                                  : (int2->y() | 0xff) - center2->y())
                    * 2 * extValue / (ext1->y() - int1->y());
                fillLines<clip, TopDown, RightToLeft>(bits, width, height, yi2, ye1, xc1, dxC,
                                                      xc2, dxC, d, ddC, dd);
            }
            if (ye1 != ye2) {
                xe1 = ext1->x() + ext1Frac * (ext1->x() - ext2->x()) / (ext1->y() - ext2->y());
                fillLines<clip, TopDown, LeftToRight>(bits, width, height, ye1, ye2, xe1, dxE,
                                                      xc2, dxC, extValue, 0, dd);
            }
        }
    }
}